

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

void XNVCTRLSetTargetAttribute
               (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
               int value)

{
  XExtDisplayInfo *info_00;
  undefined1 *puVar1;
  xnvCtrlSetAttributeReq *req;
  XExtDisplayInfo *info;
  int value_local;
  uint attribute_local;
  uint display_mask_local;
  int target_id_local;
  int target_type_local;
  Display *dpy_local;
  
  attribute_local = target_id;
  display_mask_local = target_type;
  _target_id_local = dpy;
  info_00 = find_display(dpy);
  if ((info_00 == (XExtDisplayInfo *)0x0) || (info_00->codes == (XExtCodes *)0x0)) {
    XMissingExtension(_target_id_local,nvctrl_extension_name);
  }
  else {
    XNVCTRLCheckTargetData
              (_target_id_local,info_00,(int *)&display_mask_local,(int *)&attribute_local);
    if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
      (*_target_id_local->lock_fns->lock_display)(_target_id_local);
    }
    puVar1 = (undefined1 *)_XGetRequest(_target_id_local,3,0x14);
    *puVar1 = (char)info_00->codes->major_opcode;
    puVar1[1] = 3;
    *(short *)(puVar1 + 6) = (short)display_mask_local;
    *(short *)(puVar1 + 4) = (short)attribute_local;
    *(uint *)(puVar1 + 8) = display_mask;
    *(uint *)(puVar1 + 0xc) = attribute;
    *(int *)(puVar1 + 0x10) = value;
    if (_target_id_local->lock_fns != (_XLockPtrs *)0x0) {
      (*_target_id_local->lock_fns->unlock_display)(_target_id_local);
    }
    if (_target_id_local->synchandler != (_func_int__XDisplay_ptr *)0x0) {
      (*_target_id_local->synchandler)(_target_id_local);
    }
  }
  return;
}

Assistant:

void XNVCTRLSetTargetAttribute (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    int value
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSetAttributeReq *req;

    XNVCTRLSimpleCheckExtension (dpy, info);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlSetAttribute, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSetAttribute;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    req->value = value;
    UnlockDisplay (dpy);
    SyncHandle ();
}